

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

void __thiscall wabt::interp::Instance::Instance(Instance *this,Store *store,Ref module)

{
  bool bVar1;
  
  (this->super_Object).kind_ = Instance;
  *(undefined8 *)&(this->super_Object).finalizer_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->super_Object).finalizer_.super__Function_base._M_functor + 8) = 0;
  (this->super_Object).finalizer_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->super_Object).finalizer_._M_invoker = (_Invoker_type)0x0;
  (this->super_Object).host_info_ = (void *)0x0;
  (this->super_Object).self_.index = 0;
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Instance_002e7ac0;
  (this->module_).index = module.index;
  memset(&this->imports_,0,0xd8);
  bVar1 = Store::Is<wabt::interp::Module>(store,module);
  if (bVar1) {
    return;
  }
  __assert_fail("store.Is<Module>(module)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp.cc"
                ,0x2cb,"wabt::interp::Instance::Instance(Store &, Ref)");
}

Assistant:

Instance::Instance(Store& store, Ref module) : Object(skind), module_(module) {
  assert(store.Is<Module>(module));
}